

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitAutogenTarget(cmQtAutoGenInitializer *this)

{
  uint uVar1;
  pointer ppVar2;
  pointer ppVar3;
  cmGeneratorTarget *this_00;
  pointer pcVar4;
  cmLocalGenerator *pcVar5;
  long *plVar6;
  pointer pbVar7;
  string_view suffix;
  cmQtAutoGenInitializer *pcVar8;
  anon_struct_696_16_37873454_for_AutogenTarget *paVar9;
  anon_struct_696_16_37873454_for_AutogenTarget *paVar10;
  _Head_base<0UL,_cmCustomCommand_*,_false> _Var11;
  undefined1 auVar12 [8];
  undefined8 uVar13;
  TargetType TVar14;
  long lVar15;
  string *psVar16;
  string *psVar17;
  _Rb_tree_node_base *p_Var18;
  cmLinkImplementationLibraries *pcVar19;
  mapped_type_conflict1 *pmVar20;
  element_type *peVar21;
  cmGeneratorTarget *pcVar22;
  mapped_type *pmVar23;
  cmTarget *t;
  set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
  *psVar24;
  undefined8 uVar25;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *uiFile;
  pointer filename;
  pointer __x;
  char *pcVar26;
  _Alloc_hider this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  pointer pbVar28;
  pointer pcVar29;
  byte bVar30;
  __node_base *p_Var31;
  char *pcVar32;
  pointer pcVar33;
  cmLinkItem *item;
  pointer pcVar34;
  pointer ppVar35;
  cmTarget *pcVar36;
  bool bVar37;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  string_view prefix;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar38;
  __single_object cc_3;
  __single_object cc_1;
  string tools;
  string timestampFileGenex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  cmCustomCommandLines commandLines;
  string depFile;
  cmGeneratorTarget *libTarget;
  string autogenComment;
  cmCustomCommand cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  autogenByproducts;
  string timestampFileWithoutConfig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  timestampByproducts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempTimestampFileName;
  string depFileWithoutConfig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tempDepFile;
  string timestampFileName;
  string depFileWithConfig;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_598;
  cmQtAutoGenInitializer *local_590;
  undefined1 local_588 [36];
  undefined4 local_564;
  GenVarsT *local_560;
  cmTarget *local_558;
  undefined1 local_550 [8];
  undefined1 local_548 [8];
  undefined1 local_540 [16];
  char *local_530;
  pointer local_528;
  pointer local_520;
  pointer local_518;
  pointer local_510;
  GenVarsT *local_508;
  undefined1 local_500 [8];
  undefined1 local_4f8 [8];
  undefined1 local_4f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  undefined1 local_4d0 [24];
  undefined1 local_4b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  undefined1 local_498 [32];
  undefined1 local_478 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  _Alloc_hider local_430;
  undefined1 local_428 [16];
  _Head_base<0UL,_cmCustomCommand_*,_false> local_418;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_410;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [32];
  pointer local_3c8;
  pointer pbStack_3c0;
  undefined1 auStack_3b8 [32];
  element_type *local_398;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_390;
  pointer local_388;
  _Alloc_hider local_380;
  pointer local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  undefined1 local_2e0 [12];
  undefined1 *local_2d4;
  undefined1 local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined8 local_278;
  undefined1 local_268 [32];
  pointer local_248;
  undefined1 local_240 [32];
  cmListFileBacktrace local_220;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  undefined8 local_150;
  char *pcStack_148;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  _Base_ptr local_50 [2];
  long local_40;
  
  psVar17 = &(this->AutogenTarget).InfoFile;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Makefile->OutputFiles,psVar17);
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_408);
  uVar1 = (this->QtVersion).Major;
  if ((5 < uVar1) || ((local_564 = 0, uVar1 == 5 && (0xe < (this->QtVersion).Minor)))) {
    uVar25 = 0;
    lVar15 = std::__cxx11::string::find(local_408,0x91fb13,0);
    local_564 = (undefined4)CONCAT71((int7)((ulong)uVar25 >> 8),1);
    if (lVar15 == -1) {
      lVar15 = std::__cxx11::string::find(local_408,0x933dd5,0);
      local_564 = (undefined4)CONCAT71((int7)((ulong)lVar15 >> 8),lVar15 != -1);
    }
  }
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  local_2c8._16_8_ = (pointer)0x0;
  local_2c8._0_8_ = 0;
  local_2c8._8_8_ = 0;
  local_278 = 0;
  local_288._M_allocated_capacity = 0;
  local_288._8_8_ = 0;
  local_508 = &(this->Moc).super_GenVarsT;
  if ((this->Moc).super_GenVarsT.Enabled == true) {
    AddGeneratedSource(this,&(this->Moc).CompilationFile,local_508,true);
    if ((char)local_564 == '\0') {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8;
    }
    else {
      bVar37 = this->CrossConfig;
      if (bVar37 == true) {
        (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_50);
        bVar30 = 0;
        lVar15 = std::__cxx11::string::find((char *)local_50,0x91fb13,0);
        if (lVar15 != -1) {
          bVar30 = this->UseBetterGraph ^ 1;
        }
      }
      else {
        bVar30 = 0;
      }
      if ((bVar37 != false) && (local_50[0] != (_Base_ptr)&local_40)) {
        operator_delete(local_50[0],local_40 + 1);
      }
      if (bVar30 != 0) {
        p_Var31 = &(this->Moc).CompilationFile.Config._M_h._M_before_begin;
        while (p_Var31 = p_Var31->_M_nxt, p_Var31 != (__node_base *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_288,(value_type *)(p_Var31 + 5));
        }
        goto LAB_003a3d1d;
      }
      paVar27 = &local_288;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)paVar27,&(this->Moc).CompilationFileGenex);
  }
LAB_003a3d1d:
  local_560 = &(this->Uic).super_GenVarsT;
  if ((this->Uic).super_GenVarsT.Enabled == true) {
    filename = (this->Uic).UiHeaders.
               super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->Uic).UiHeaders.
             super__Vector_base<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmQtAutoGen::ConfigString,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (filename != ppVar2) {
      do {
        AddGeneratedSource(this,&filename->first,local_560,false);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2c8,&filename->second);
        filename = filename + 1;
      } while (filename != ppVar2);
    }
  }
  local_458._M_allocated_capacity = (size_type)&local_448;
  local_458._8_8_ = 0;
  local_448._M_local_buf[0] = '\0';
  local_548 = (undefined1  [8])0x0;
  local_540._0_8_ = local_540._0_8_ & 0xffffffffffffff00;
  local_550 = (undefined1  [8])local_540;
  if (((GenVarsT *)&local_508->Enabled)->Enabled == true) {
    std::__cxx11::string::append(local_550);
  }
  if (((GenVarsT *)&local_560->Enabled)->Enabled == true) {
    if (local_548 != (undefined1  [8])0x0) {
      std::__cxx11::string::append(local_550);
    }
    std::__cxx11::string::append(local_550);
  }
  psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
  local_408._0_8_ = (pointer)0xa;
  local_408._8_8_ = "Automatic ";
  local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3f8._8_8_ = local_548;
  local_3e8._0_8_ = local_550;
  local_3e8._8_8_ = (pointer)0x0;
  local_3e8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
  local_3e8._24_8_ = " for target ";
  local_3c8 = (pointer)0x0;
  auStack_3b8._0_8_ = (psVar16->_M_dataplus)._M_p;
  pbStack_3c0 = (pointer)psVar16->_M_string_length;
  auStack_3b8._8_8_ = (pointer)0x0;
  views._M_len = 4;
  views._M_array = (iterator)local_408;
  cmCatViews((string *)local_500,views);
  std::__cxx11::string::operator=((string *)local_458._M_local_buf,(string *)local_500);
  if (local_500 != (undefined1  [8])local_4f0) {
    operator_delete((void *)local_500,(ulong)(local_4f0._0_8_ + 1));
  }
  if (local_550 != (undefined1  [8])local_540) {
    operator_delete((void *)local_550,(ulong)(local_540._0_8_ + 1));
  }
  local_4b8._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_4b8._8_8_ = (pointer)0x0;
  local_4a8._M_allocated_capacity = 0;
  local_408._0_8_ = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"cmake_autogen","");
  AddCMakeProcessToCommandLines(this,psVar17,(string *)local_408,(cmCustomCommandLines *)local_4b8);
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  (*this->GlobalGen->_vptr_cmGlobalGenerator[3])(local_408);
  lVar15 = std::__cxx11::string::find(local_408,0x940002,0);
  bVar37 = lVar15 != -1;
  if ((undefined1 *)local_408._0_8_ != local_3f8) {
    operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
  }
  if (lVar15 != -1) {
    bVar37 = (bool)(~(this->AutogenTarget).GlobalTarget & lVar15 != -1 &
                   (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count == 0);
  }
  if (bVar37 == false) {
    local_590 = this;
    if ((this->AutogenTarget).DependOrigin == true) {
      local_4f0._8_8_ = local_4f8;
      local_4f8 = (undefined1  [8])((ulong)local_4f8 & 0xffffffff00000000);
      local_4f0._0_8_ = (pointer)0x0;
      local_4e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pbVar28 = (this->ConfigsList).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_248 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_4e0._M_allocated_capacity = local_4f0._8_8_;
      if (pbVar28 != local_248) {
        do {
          pcVar19 = cmGeneratorTarget::GetLinkImplementationLibraries
                              (local_590->GenTarget,pbVar28,Link);
          if (pcVar19 != (cmLinkImplementationLibraries *)0x0) {
            pcVar29 = (pcVar19->Libraries).
                      super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_4a8._8_8_ =
                 (pcVar19->Libraries).
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (pcVar29 != (pointer)local_4a8._8_8_) {
              do {
                local_478._0_8_ = (pcVar29->super_cmLinkItem).Target;
                if ((cmGeneratorTarget *)local_478._0_8_ != (cmGeneratorTarget *)0x0) {
                  pcVar22 = local_590->GenTarget;
                  local_588._0_8_ = local_478._0_8_;
                  TVar14 = cmGeneratorTarget::GetType(pcVar22);
                  if ((TVar14 == STATIC_LIBRARY) &&
                     (TVar14 = cmGeneratorTarget::GetType((cmGeneratorTarget *)local_588._0_8_),
                     TVar14 == STATIC_LIBRARY)) {
                    local_548 = (undefined1  [8])((ulong)local_548 & 0xffffffff00000000);
                    local_540._0_8_ = (_Base_ptr)0x0;
                    local_540._8_8_ = local_548;
                    local_528 = (pointer)0x0;
                    local_3c8 = (pointer)0x0;
                    pbStack_3c0 = (pointer)0x0;
                    local_3e8._16_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_3e8._24_8_ = (cmGeneratorTarget *)0x0;
                    local_3e8._0_8_ = (cmCustomCommand *)0x0;
                    local_3e8._8_8_ = (pointer)0x0;
                    local_3f8._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_3f8._8_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_408._0_8_ = (pointer)0x0;
                    local_408._8_8_ = (pointer)0x0;
                    local_530 = (char *)local_540._8_8_;
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::_M_initialize_map((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                         *)local_408,0);
                    std::
                    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    ::_M_insert_unique<cmGeneratorTarget_const*const&>
                              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                *)local_550,(cmGeneratorTarget **)local_588);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3e8._16_8_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&local_3c8[-1].field_2 + 8)) {
                      std::deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                      ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                  *)local_408,(cmGeneratorTarget **)local_588);
                    }
                    else {
                      ((_Alloc_hider *)local_3e8._16_8_)->_M_p = (pointer)local_588._0_8_;
                      local_3e8._16_8_ = local_3e8._16_8_ + 8;
                    }
                    local_558 = (cmTarget *)((ulong)local_558 & 0xffffffff00000000);
                    do {
                      if (local_3e8._16_8_ == local_3f8._0_8_) break;
                      this_00 = *(cmGeneratorTarget **)local_3f8._0_8_;
                      if ((PolicyStatus *)local_3f8._0_8_ ==
                          &((cmCustomCommand *)(local_3e8._0_8_ + -0x140))->CMP0147Status) {
                        operator_delete((void *)local_3f8._8_8_,0x200);
                        local_3f8._0_8_ = *(size_type *)(local_3e8._8_8_ + 8);
                        local_3e8._0_8_ = local_3f8._0_8_ + 0x200;
                        local_3f8._8_8_ = local_3f8._0_8_;
                        local_3e8._8_8_ = (size_type *)(local_3e8._8_8_ + 8);
                      }
                      else {
                        local_3f8._0_8_ = local_3f8._0_8_ + 8;
                      }
                      if (this_00 == pcVar22) {
                        local_558 = (cmTarget *)
                                    CONCAT44(local_558._4_4_,
                                             (int)CONCAT71((int7)((ulong)local_3f8._0_8_ >> 8),1));
                      }
                      else {
                        pcVar19 = cmGeneratorTarget::GetLinkImplementationLibraries
                                            (this_00,pbVar28,Link);
                        if (pcVar19 != (cmLinkImplementationLibraries *)0x0) {
                          pcVar4 = (pcVar19->Libraries).
                                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          for (pcVar34 = (pcVar19->Libraries).
                                         super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                              pcVar34 != pcVar4; pcVar34 = pcVar34 + 1) {
                            local_498._0_8_ = (pcVar34->super_cmLinkItem).Target;
                            if ((((cmGeneratorTarget *)local_498._0_8_ != (cmGeneratorTarget *)0x0)
                                && (TVar14 = cmGeneratorTarget::GetType
                                                       ((cmGeneratorTarget *)local_498._0_8_),
                                   TVar14 == STATIC_LIBRARY)) &&
                               (pVar38 = std::
                                         _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                         ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                                   ((
                                                  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                                  *)local_550,(cmGeneratorTarget **)local_498),
                               ((undefined1  [16])pVar38 & (undefined1  [16])0x1) !=
                               (undefined1  [16])0x0)) {
                              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3e8._16_8_ ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_3c8[-1].field_2 + 8)) {
                                std::
                                deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                ::_M_push_back_aux<cmGeneratorTarget_const*const&>
                                          ((deque<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>
                                            *)local_408,(cmGeneratorTarget **)local_498);
                              }
                              else {
                                ((_Alloc_hider *)local_3e8._16_8_)->_M_p = (pointer)local_498._0_8_;
                                local_3e8._16_8_ = local_3e8._16_8_ + 8;
                              }
                            }
                          }
                        }
                      }
                    } while (this_00 != pcVar22);
                    std::
                    _Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Deque_base((_Deque_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                    *)local_408);
                    std::
                    _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                                 *)local_550);
                    if (((ulong)local_558 & 1) != 0) goto LAB_003a4898;
                  }
                  pmVar20 = std::
                            map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                            ::operator[]((map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                                          *)local_500,(key_type *)local_478);
                  *pmVar20 = *pmVar20 + 1;
                }
LAB_003a4898:
                pcVar29 = pcVar29 + 1;
              } while (pcVar29 != (pointer)local_4a8._8_8_);
            }
          }
          pbVar28 = pbVar28 + 1;
        } while (pbVar28 != local_248);
      }
      this = local_590;
      if ((element_type *)local_4f0._8_8_ != (element_type *)local_4f8) {
        paVar9 = &local_590->AutogenTarget;
        peVar21 = (element_type *)local_4f0._8_8_;
        do {
          if ((peVar21->Value).FilePath._M_string_length ==
              (long)(this->ConfigsList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->ConfigsList).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) {
            std::
            _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
            ::_M_insert_unique<cmTarget*const&>
                      ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                        *)&paVar9->DependTargets,
                       (cmTarget **)(peVar21->Value).FilePath._M_dataplus._M_p);
          }
          peVar21 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)peVar21);
        } while (peVar21 != (element_type *)local_4f8);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                   *)local_500);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_4d0,
               (this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,(_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )&(this->AutogenTarget).DependFiles._M_t._M_impl.super__Rb_tree_header,
               (allocator_type *)local_408);
    if ((char)local_564 == '\0') {
      local_558 = (cmTarget *)0x0;
    }
    else {
      psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(this->GenTarget);
      local_408._8_8_ = (psVar17->_M_dataplus)._M_p;
      local_408._0_8_ = psVar17->_M_string_length;
      local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_3f8._8_8_ = 0x17;
      local_3e8._0_8_ = "_autogen_timestamp_deps";
      local_3e8._8_8_ = (pointer)0x0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_408;
      cmCatViews((string *)local_500,views_01);
      std::make_unique<cmCustomCommand>();
      pcVar33 = (this->Dir).Work._M_dataplus._M_p;
      if (pcVar33 == (pointer)0x0) {
        pcVar33 = "";
      }
      pcVar32 = (char *)((local_598._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar17 = &(local_598._M_head_impl)->WorkingDirectory;
      strlen(pcVar33);
      std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar32,(ulong)pcVar33);
      _Var11._M_head_impl = local_598._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4d0);
      cmCustomCommand::SetDepends(_Var11._M_head_impl,&local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0);
      cmCustomCommand::SetEscapeOldStyle(local_598._M_head_impl,false);
      local_418._M_head_impl = local_598._M_head_impl;
      local_598._M_head_impl = (cmCustomCommand *)0x0;
      local_558 = cmLocalGenerator::AddUtilityCommand
                            (this->LocalGen,(string *)local_500,true,
                             (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)
                             &local_418);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_418);
      pcVar5 = this->LocalGen;
      pcVar22 = (cmGeneratorTarget *)operator_new(0xaa8);
      cmGeneratorTarget::cmGeneratorTarget(pcVar22,local_558,pcVar5);
      local_428._8_8_ = pcVar22;
      cmLocalGenerator::AddGeneratorTarget
                (pcVar5,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        (local_428 + 8));
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                 (local_428 + 8));
      if ((this->TargetsFolder)._M_string_length != 0) {
        local_408._0_8_ = local_3f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"FOLDER","");
        cmTarget::SetProperty(local_558,(string *)local_408,(cmValue)&this->TargetsFolder);
        if ((undefined1 *)local_408._0_8_ != local_3f8) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
        }
      }
      uVar25 = local_4d0._0_8_;
      if (local_4d0._8_8_ != local_4d0._0_8_) {
        paVar27 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4d0._0_8_)->field_2;
        do {
          plVar6 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar27 + -1))->_M_dataplus)._M_p;
          if (paVar27 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar6) {
            operator_delete(plVar6,paVar27->_M_allocated_capacity + 1);
          }
          ppVar35 = (pointer)(paVar27 + 1);
          paVar27 = paVar27 + 2;
        } while (ppVar35 != (pointer)local_4d0._8_8_);
        local_4d0._8_8_ = uVar25;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4d0,(value_type *)local_500);
      AddAutogenExecutableToDependencies
                (this,local_508,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4d0);
      AddAutogenExecutableToDependencies
                (this,local_560,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4d0);
      local_588._0_8_ = local_588 + 0x10;
      local_588._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_588[0x10] = '\0';
      local_498._0_8_ = local_498 + 0x10;
      local_498._8_8_ = 0;
      local_498[0x10] = '\0';
      if ((this->MultiConfig == true) && (this->UseBetterGraph == true)) {
        local_478._0_8_ = local_478 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"$<CONFIG>","");
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"timestamp_","");
        local_408._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_408._0_8_ = (this->Dir).Build._M_string_length;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._8_8_ = 6;
        local_3e8._0_8_ = "/deps_";
        local_3e8._8_8_ = (pointer)0x0;
        views_02._M_len = 2;
        views_02._M_array = (iterator)local_408;
        cmCatViews((string *)local_240,views_02);
        std::operator+(&local_1b0,&local_2a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478);
        local_408._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_408._0_8_ = (this->Dir).Build._M_string_length;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._8_8_ = 1;
        local_3e8._0_8_ = "/";
        local_3e8._8_8_ = (pointer)0x0;
        local_3e8._16_8_ = local_1b0._M_string_length;
        local_3e8._24_8_ = local_1b0._M_dataplus._M_p;
        local_3c8 = (pointer)0x0;
        views_03._M_len = 3;
        views_03._M_array = (iterator)local_408;
        cmCatViews((string *)local_550,views_03);
        std::__cxx11::string::operator=((string *)local_588,(string *)local_550);
        if (local_550 != (undefined1  [8])local_540) {
          operator_delete((void *)local_550,(ulong)(local_540._0_8_ + 1));
        }
        local_408._0_8_ = local_240._8_8_;
        local_408._8_8_ = local_240._0_8_;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._8_8_ = local_478._8_8_;
        local_3e8._0_8_ = local_478._0_8_;
        local_3e8._8_8_ = (pointer)0x0;
        views_04._M_len = 2;
        views_04._M_array = (iterator)local_408;
        cmCatViews(&local_170,views_04);
        std::__cxx11::string::_M_assign((string *)local_498);
        psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_408._8_8_ = (psVar17->_M_dataplus)._M_p;
        local_408._0_8_ = psVar17->_M_string_length;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
        local_3f8._8_8_ = "-E";
        local_3e8._0_8_ = (pointer)0x5;
        local_3e8._8_8_ = "touch";
        local_3e8._16_8_ = local_588._8_8_;
        local_3e8._24_8_ = local_588._0_8_;
        ilist_00._M_len = 4;
        ilist_00._M_array = (iterator)local_408;
        cmMakeCommandLine((cmCustomCommandLine *)local_550,ilist_00);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4b8,
                   (cmCustomCommandLine *)local_550);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_550);
        local_408._0_8_ = local_3f8;
        local_408._8_8_ = (pointer)0x0;
        local_3f8._0_8_ = local_3f8._0_8_ & 0xffffffffffffff00;
        local_3e8._0_8_ = auStack_3b8;
        local_3e8._8_8_ = &DAT_00000001;
        local_3e8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3e8._24_8_ = (cmGeneratorTarget *)0x0;
        local_3c8 = (pointer)CONCAT44(local_3c8._4_4_,0x3f800000);
        pbStack_3c0 = (pointer)0x0;
        auStack_3b8._0_8_ = (pointer)0x0;
        pbVar28 = (this->ConfigsList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar7 = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar28 != pbVar7) {
          local_4a8._8_8_ = &(local_590->AutogenTarget).DepFileRuleName.Config;
          local_560 = (GenVarsT *)&(local_590->AutogenTarget).DepFile.Config;
          do {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_268,&local_2a8,pbVar28);
            std::operator+(&local_1d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_240,pbVar28);
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_3e8,pbVar28);
            std::__cxx11::string::_M_assign((string *)pmVar23);
            local_548 = (undefined1  [8])(local_590->Dir).RelativeBuild._M_dataplus._M_p;
            local_550 = (undefined1  [8])(local_590->Dir).RelativeBuild._M_string_length;
            local_540._0_8_ = (_Base_ptr)0x0;
            local_540._8_8_ = &DAT_00000001;
            local_530 = (char *)((long)"in Json::Value::setComment(): Comments must start with /" +
                                0x37);
            local_528 = (pointer)0x0;
            local_520 = (pointer)local_268._8_8_;
            local_518 = (pointer)local_268._0_8_;
            local_510 = (pointer)0x0;
            views_05._M_len = 3;
            views_05._M_array = (iterator)local_550;
            cmCatViews(&local_1f0,views_05);
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_4a8._8_8_,pbVar28);
            std::__cxx11::string::operator=((string *)pmVar23,(string *)&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            pmVar23 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_560,pbVar28);
            std::__cxx11::string::_M_assign((string *)pmVar23);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_268._0_8_ != (pointer)(local_268 + 0x10)) {
              operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
            }
            pbVar28 = pbVar28 + 1;
          } while (pbVar28 != pbVar7);
        }
        this = local_590;
        AddGeneratedSource(local_590,(ConfigString *)local_408,local_508,false);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_3e8);
        if ((cmCustomCommand *)local_408._0_8_ != (cmCustomCommand *)local_3f8) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_240._0_8_ != (pointer)(local_240 + 0x10)) {
          operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        if ((cmGeneratorTarget *)local_478._0_8_ != (cmGeneratorTarget *)(local_478 + 0x10)) {
          operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
        }
      }
      else {
        local_408._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_408._0_8_ = (this->Dir).Build._M_string_length;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._8_8_ = 1;
        local_3e8._0_8_ = "/";
        local_3e8._8_8_ = (pointer)0x0;
        local_3e8._16_8_ = (_Hash_node_base *)0x9;
        local_3e8._24_8_ = "timestamp";
        local_3c8 = (pointer)0x0;
        views_06._M_len = 3;
        views_06._M_array = (iterator)local_408;
        cmCatViews((string *)local_550,views_06);
        std::__cxx11::string::operator=((string *)local_588,(string *)local_550);
        if (local_550 != (undefined1  [8])local_540) {
          operator_delete((void *)local_550,(ulong)(local_540._0_8_ + 1));
        }
        local_408._8_8_ = (this->Dir).Build._M_dataplus._M_p;
        local_408._0_8_ = (this->Dir).Build._M_string_length;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._8_8_ = 5;
        local_3e8._0_8_ = "/deps";
        local_3e8._8_8_ = (pointer)0x0;
        views_07._M_len = 2;
        views_07._M_array = (iterator)local_408;
        cmCatViews((string *)local_550,views_07);
        std::__cxx11::string::operator=
                  ((string *)&(this->AutogenTarget).DepFile,(string *)local_550);
        if (local_550 != (undefined1  [8])local_540) {
          operator_delete((void *)local_550,(ulong)(local_540._0_8_ + 1));
        }
        std::__cxx11::string::_M_assign((string *)local_498);
        local_408._8_8_ = (this->Dir).RelativeBuild._M_dataplus._M_p;
        local_408._0_8_ = (this->Dir).RelativeBuild._M_string_length;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._8_8_ = 1;
        local_3e8._0_8_ = "/";
        local_3e8._8_8_ = (pointer)0x0;
        local_3e8._16_8_ = (_Hash_node_base *)0x9;
        local_3e8._24_8_ = "timestamp";
        local_3c8 = (pointer)0x0;
        views_08._M_len = 3;
        views_08._M_array = (iterator)local_408;
        cmCatViews((string *)local_550,views_08);
        std::__cxx11::string::operator=
                  ((string *)&(this->AutogenTarget).DepFileRuleName,(string *)local_550);
        if (local_550 != (undefined1  [8])local_540) {
          operator_delete((void *)local_550,(ulong)(local_540._0_8_ + 1));
        }
        psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_408._8_8_ = (psVar17->_M_dataplus)._M_p;
        local_408._0_8_ = psVar17->_M_string_length;
        local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
        local_3f8._8_8_ = "-E";
        local_3e8._0_8_ = (cmCustomCommand *)0x5;
        local_3e8._8_8_ = "touch";
        local_3e8._16_8_ = local_588._8_8_;
        local_3e8._24_8_ = local_588._0_8_;
        ilist_01._M_len = 4;
        ilist_01._M_array = (iterator)local_408;
        cmMakeCommandLine((cmCustomCommandLine *)local_550,ilist_01);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4b8,
                   (cmCustomCommandLine *)local_550);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_550);
        AddGeneratedSource(this,(string *)local_588,local_508,false);
      }
      std::make_unique<cmCustomCommand>();
      uVar25 = local_408._0_8_;
      _Var11._M_head_impl = local_598._M_head_impl;
      local_408._0_8_ = (pointer)0x0;
      local_598._M_head_impl = (cmCustomCommand *)uVar25;
      if (_Var11._M_head_impl != (cmCustomCommand *)0x0) {
        cmCustomCommand::~cmCustomCommand(_Var11._M_head_impl);
        operator_delete(_Var11._M_head_impl,0x140);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_408);
      _Var11._M_head_impl = local_598._M_head_impl;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_588._0_8_,
                 (char *)((long)&((_Alloc_hider *)local_588._8_8_)->_M_p + local_588._0_8_));
      cmCustomCommand::SetOutputs(_Var11._M_head_impl,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      _Var11._M_head_impl = local_598._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_288);
      cmCustomCommand::SetByproducts(_Var11._M_head_impl,&local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      _Var11._M_head_impl = local_598._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4d0);
      cmCustomCommand::SetDepends(_Var11._M_head_impl,&local_e0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_e0);
      _Var11._M_head_impl = local_598._M_head_impl;
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
                (&local_f8,
                 (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4b8);
      cmCustomCommand::SetCommandLines(_Var11._M_head_impl,(cmCustomCommandLines *)&local_f8);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_f8);
      cmCustomCommand::SetComment(local_598._M_head_impl,(char *)local_458._M_allocated_capacity);
      pcVar33 = (this->Dir).Work._M_dataplus._M_p;
      pcVar32 = "";
      if (pcVar33 != (pointer)0x0) {
        pcVar32 = pcVar33;
      }
      pcVar26 = (char *)((local_598._M_head_impl)->WorkingDirectory)._M_string_length;
      psVar17 = &(local_598._M_head_impl)->WorkingDirectory;
      strlen(pcVar32);
      std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar26,(ulong)pcVar32);
      cmCustomCommand::SetEscapeOldStyle(local_598._M_head_impl,false);
      cmCustomCommand::SetDepfile(local_598._M_head_impl,(string *)local_498);
      (local_598._M_head_impl)->StdPipesUTF8 = true;
      local_428._0_8_ = local_598._M_head_impl;
      local_598._M_head_impl = (cmCustomCommand *)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_428,
                 false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_428);
      uVar25 = local_4d0._8_8_;
      if (local_4d0._8_8_ != local_4d0._0_8_) {
        paVar27 = &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4d0._0_8_)->field_2;
        do {
          plVar6 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar27 + -1))->_M_dataplus)._M_p;
          if (paVar27 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar6) {
            operator_delete(plVar6,paVar27->_M_allocated_capacity + 1);
          }
          ppVar35 = (pointer)(paVar27 + 1);
          paVar27 = paVar27 + 2;
        } while (ppVar35 != (pointer)uVar25);
        local_4d0._8_8_ = local_4d0._0_8_;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_4d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588);
      uVar13 = local_4b8._8_8_;
      uVar25 = local_4b8._0_8_;
      this_01._M_p = (pointer)local_4b8._0_8_;
      if (local_4b8._8_8_ != local_4b8._0_8_) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_01._M_p);
          this_01._M_p = this_01._M_p + 0x18;
        } while (this_01._M_p != (pointer)uVar13);
        local_4b8._8_8_ = uVar25;
      }
      local_458._8_8_ = 0;
      *(char *)local_458._M_allocated_capacity = '\0';
      if ((cmGeneratorTarget *)local_498._0_8_ != (cmGeneratorTarget *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,CONCAT71(local_498._17_7_,local_498[0x10]) + 1);
      }
      if ((cmGeneratorTarget *)local_588._0_8_ != (cmGeneratorTarget *)(local_588 + 0x10)) {
        operator_delete((void *)local_588._0_8_,CONCAT71(local_588._17_7_,local_588[0x10]) + 1);
      }
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_598);
      if (local_500 != (undefined1  [8])local_4f0) {
        operator_delete((void *)local_500,(ulong)(local_4f0._0_8_ + 1));
      }
    }
    std::make_unique<cmCustomCommand>();
    pcVar33 = (this->Dir).Work._M_dataplus._M_p;
    pcVar32 = "";
    if (pcVar33 != (pointer)0x0) {
      pcVar32 = pcVar33;
    }
    pcVar26 = *(char **)((long)local_550 + 0xd0);
    psVar17 = (string *)((long)local_550 + 200);
    strlen(pcVar32);
    std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar26,(ulong)pcVar32);
    auVar12 = local_550;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_110,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
    cmCustomCommand::SetByproducts((cmCustomCommand *)auVar12,&local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_110);
    auVar12 = local_550;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_128,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4d0);
    cmCustomCommand::SetDepends((cmCustomCommand *)auVar12,&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    auVar12 = local_550;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_140,
               (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4b8);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)auVar12,(cmCustomCommandLines *)&local_140);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_140);
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_550,false);
    cmCustomCommand::SetComment
              ((cmCustomCommand *)local_550,(char *)local_458._M_allocated_capacity);
    paVar9 = &this->AutogenTarget;
    local_430._M_p = (pointer)local_550;
    local_550 = (undefined1  [8])0x0;
    t = cmLocalGenerator::AddUtilityCommand
                  (this->LocalGen,&paVar9->Name,true,
                   (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_430)
    ;
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_430);
    pcVar5 = this->LocalGen;
    pcVar22 = (cmGeneratorTarget *)operator_new(0xaa8);
    cmGeneratorTarget::cmGeneratorTarget(pcVar22,t,pcVar5);
    local_438._M_p = (pointer)pcVar22;
    cmLocalGenerator::AddGeneratorTarget
              (pcVar5,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                      &local_438);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&local_438)
    ;
    pcVar36 = t;
    if (local_558 != (cmTarget *)0x0) {
      pcVar36 = local_558;
    }
    if ((this->AutogenTarget).DependOrigin == true) {
      psVar24 = cmGeneratorTarget::GetUtilities_abi_cxx11_(local_590->GenTarget);
      for (p_Var18 = (psVar24->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var18 != &(psVar24->_M_t)._M_impl.super__Rb_tree_header;
          p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
        cmTarget::AddUtility(pcVar36,(string *)(p_Var18 + 1),false,local_590->Makefile);
      }
    }
    paVar10 = &local_590->AutogenTarget;
    p_Var18 = (local_590->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    pcVar8 = local_590;
    while (local_590 = pcVar8,
          (_Rb_tree_header *)p_Var18 != &(paVar10->DependTargets)._M_t._M_impl.super__Rb_tree_header
          ) {
      psVar17 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var18 + 1));
      cmTarget::AddUtility(pcVar36,psVar17,false,local_590->Makefile);
      p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
      pcVar8 = local_590;
    }
    if ((pcVar8->TargetsFolder)._M_string_length != 0) {
      local_408._0_8_ = local_3f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"FOLDER","");
      cmTarget::SetProperty(t,(string *)local_408,(cmValue)&pcVar8->TargetsFolder);
      if ((undefined1 *)local_408._0_8_ != local_3f8) {
        operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
      }
    }
    cmTarget::AddUtility(pcVar8->GenTarget->Target,&paVar9->Name,false,pcVar8->Makefile);
    if ((pcVar8->AutogenTarget).GlobalTarget == true) {
      cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
                (pcVar8->GlobalInitializer,pcVar8->LocalGen,&paVar9->Name);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_550);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4d0);
  }
  else {
    for (p_Var18 = (this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_left;
        (_Rb_tree_header *)p_Var18 !=
        &(this->AutogenTarget).DependTargets._M_t._M_impl.super__Rb_tree_header;
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
      pcVar36 = this->GenTarget->Target;
      psVar17 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(p_Var18 + 1));
      cmTarget::AddUtility(pcVar36,psVar17,false,this->Makefile);
    }
    if (((this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->Uic).UiFilesNoOptions.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Uic).UiFilesWithOptions.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_3e8._0_8_ = auStack_3b8;
      local_408._0_8_ = local_3f8;
      local_408._8_8_ = (pointer)0x0;
      local_3f8._0_8_ = local_3f8._0_8_ & 0xffffffffffffff00;
      local_3e8._8_8_ = &DAT_00000001;
      local_3e8._16_8_ = (_Hash_node_base *)0x0;
      local_3e8._24_8_ = (pointer)0x0;
      local_3c8._4_4_ = (undefined4)((ulong)local_3c8 >> 0x20);
      local_3c8 = (pointer)CONCAT44(local_3c8._4_4_,1.0);
      pbStack_3c0 = (pointer)0x0;
      auStack_3b8._0_8_ = (pointer)0x0;
      local_500 = (undefined1  [8])local_4f0;
      local_4f8 = (undefined1  [8])0x0;
      local_4f0._0_8_ = local_4f0._0_8_ & 0xffffffffffffff00;
      local_548 = (undefined1  [8])(this->Dir).Build._M_dataplus._M_p;
      local_550 = (undefined1  [8])(this->Dir).Build._M_string_length;
      local_540._0_8_ = (_Base_ptr)0x0;
      local_540._8_8_ = (pointer)0x8;
      local_530 = "/autouic";
      local_528 = (pointer)0x0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_550;
      cmCatViews((string *)local_588,views_00);
      local_150 = 6;
      pcStack_148 = ".stamp";
      suffix._M_str = ".stamp";
      suffix._M_len = 6;
      prefix._M_str = (char *)local_588._0_8_;
      prefix._M_len = local_588._8_8_;
      ConfigFileNamesAndGenex(this,(ConfigString *)local_408,(string *)local_500,prefix,suffix);
      if ((cmGeneratorTarget *)local_588._0_8_ != (cmGeneratorTarget *)(local_588 + 0x10)) {
        operator_delete((void *)local_588._0_8_,CONCAT71(local_588._17_7_,local_588[0x10]) + 1);
      }
      AddGeneratedSource(this,(ConfigString *)local_408,local_560,false);
      psVar17 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      local_548 = (undefined1  [8])(psVar17->_M_dataplus)._M_p;
      local_550 = (undefined1  [8])psVar17->_M_string_length;
      local_540._0_8_ = (_Base_ptr)0x2;
      local_540._8_8_ = "-E";
      local_530 = (char *)0x5;
      local_528 = (pointer)0x940020;
      local_520 = (pointer)local_4f8;
      local_518 = (pointer)local_500;
      ilist._M_len = 4;
      ilist._M_array = (iterator)local_550;
      cmMakeCommandLine((cmCustomCommandLine *)local_588,ilist);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
      emplace_back<cmCustomCommandLine>
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4b8,
                 (cmCustomCommandLine *)local_588);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_588);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_550,&(this->Uic).UiFilesNoOptions);
      __x = (this->Uic).UiFilesWithOptions.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (this->Uic).UiFilesWithOptions.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__x != ppVar3) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_550,&__x->first);
          __x = __x + 1;
        } while (__x != ppVar3);
      }
      AddAutogenExecutableToDependencies
                (this,local_560,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_550);
      std::make_unique<cmCustomCommand>();
      uVar25 = local_588._0_8_;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_500,(pointer)((long)local_4f8 + (long)local_500));
      cmCustomCommand::SetOutputs((cmCustomCommand *)uVar25,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      uVar25 = local_588._0_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_550);
      cmCustomCommand::SetDepends((cmCustomCommand *)uVar25,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      cmCustomCommand::SetComment((cmCustomCommand *)local_588._0_8_,"");
      pcVar32 = (this->Dir).Work._M_dataplus._M_p;
      pcVar26 = "";
      if (pcVar32 != (char *)0x0) {
        pcVar26 = pcVar32;
      }
      pcVar32 = *(char **)&(((ConfigAndLanguageToBTStrings *)(local_588._0_8_ + 0xd0))->_M_t).
                           _M_impl;
      psVar17 = (string *)(local_588._0_8_ + 200);
      strlen(pcVar26);
      std::__cxx11::string::_M_replace((ulong)psVar17,0,pcVar32,(ulong)pcVar26);
      cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_588._0_8_,false);
      *(bool *)(local_588._0_8_ + 0x12e) = true;
      local_410._M_head_impl = (cmCustomCommand *)local_588._0_8_;
      local_588._0_8_ = (cmGeneratorTarget *)0x0;
      cmLocalGenerator::AddCustomCommandToOutput
                (this->LocalGen,
                 (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_410,
                 false);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_410);
      std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_588);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_550);
      if (local_500 != (undefined1  [8])local_4f0) {
        operator_delete((void *)local_500,(ulong)(local_4f0._0_8_ + 1));
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_3e8);
      if ((undefined1 *)local_408._0_8_ != local_3f8) {
        operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
      }
    }
    auStack_3b8._0_8_ = (pointer)0x0;
    auStack_3b8._8_8_ = (pointer)0x0;
    local_3c8 = (pointer)0x0;
    pbStack_3c0 = (pointer)0x0;
    local_3e8._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3e8._24_8_ = (cmGeneratorTarget *)0x0;
    local_3e8._0_8_ = (cmCustomCommand *)0x0;
    local_3e8._8_8_ = (pointer)0x0;
    local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_408._0_8_ = (pointer)0x0;
    local_408._8_8_ = (pointer)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(auStack_3b8 + 0x10));
    local_380._M_p = (pointer)&local_370;
    local_398 = (element_type *)0x0;
    _Stack_390._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_388 = (pointer)0x0;
    local_378 = (pointer)0x0;
    local_370._M_local_buf[0] = '\0';
    local_360._M_allocated_capacity = (size_type)&local_350;
    local_360._8_8_ = 0;
    local_350._M_local_buf[0] = '\0';
    local_340._M_allocated_capacity = (size_type)&local_330;
    local_340._8_8_ = (char *)0x0;
    local_330._M_local_buf[0] = '\0';
    local_320._M_allocated_capacity = (size_type)&local_310;
    local_320._8_8_ = 0;
    local_310._M_local_buf[0] = '\0';
    local_300._M_allocated_capacity = (size_type)&local_2f0;
    local_300._8_8_ = 0;
    local_2f0._M_local_buf[0] = '\0';
    local_2e0[0] = false;
    local_2e0[1] = false;
    local_2e0[2] = false;
    local_2e0[3] = true;
    local_2e0[8] = false;
    local_2e0[4] = false;
    local_2e0[5] = false;
    local_2e0[6] = false;
    local_2e0[7] = false;
    local_2d4 = &DAT_200000002;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_80,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2c8);
    cmCustomCommand::SetByproducts((cmCustomCommand *)local_408,&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
              (&local_98,
               (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4b8);
    cmCustomCommand::SetCommandLines((cmCustomCommand *)local_408,(cmCustomCommandLines *)&local_98)
    ;
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_98);
    cmCustomCommand::SetComment
              ((cmCustomCommand *)local_408,(char *)local_458._M_allocated_capacity);
    cmMakefile::GetBacktrace(this->Makefile);
    cmCustomCommand::SetBacktrace((cmCustomCommand *)local_408,&local_220);
    if (local_220.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_220.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    uVar25 = local_340._8_8_;
    pcVar33 = (this->Dir).Work._M_dataplus._M_p;
    pcVar32 = "";
    if (pcVar33 != (pointer)0x0) {
      pcVar32 = pcVar33;
    }
    strlen(pcVar32);
    std::__cxx11::string::_M_replace((ulong)&local_340,0,(char *)uVar25,(ulong)pcVar32);
    local_2e0[6] = true;
    cmCustomCommand::SetEscapeOldStyle((cmCustomCommand *)local_408,false);
    cmCustomCommand::SetEscapeAllowMakeVars((cmCustomCommand *)local_408,true);
    cmTarget::AddPreBuildCommand(this->GenTarget->Target,(cmCustomCommand *)local_408);
    cmCustomCommand::~cmCustomCommand((cmCustomCommand *)local_408);
  }
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_allocated_capacity != &local_448) {
    operator_delete((void *)local_458._M_allocated_capacity,
                    CONCAT71(local_448._M_allocated_capacity._1_7_,local_448._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2c8);
  return true;
}

Assistant:

bool cmQtAutoGenInitializer::InitAutogenTarget()
{
  // Register info file as generated by CMake
  this->Makefile->AddCMakeOutputFile(this->AutogenTarget.InfoFile);

  // Determine whether to use a depfile for the AUTOGEN target.
  bool const useDepfile = [this]() -> bool {
    auto const& gen = this->GlobalGen->GetName();
    return this->QtVersion >= IntegerVersion(5, 15) &&
      (gen.find("Ninja") != std::string::npos ||
       gen.find("Make") != std::string::npos);
  }();

  // Files provided by the autogen target
  std::vector<std::string> autogenByproducts;
  std::vector<std::string> timestampByproducts;
  if (this->Moc.Enabled) {
    this->AddGeneratedSource(this->Moc.CompilationFile, this->Moc, true);
    if (useDepfile) {
      if (this->CrossConfig &&
          this->GlobalGen->GetName().find("Ninja") != std::string::npos &&
          !this->UseBetterGraph) {
        // Make all mocs_compilation_<CONFIG>.cpp files byproducts of the
        // ${target}_autogen/timestamp custom command.
        // We cannot just use Moc.CompilationFileGenex here, because that
        // custom command runs cmake_autogen for each configuration.
        for (const auto& p : this->Moc.CompilationFile.Config) {
          timestampByproducts.push_back(p.second);
        }
      } else {
        timestampByproducts.push_back(this->Moc.CompilationFileGenex);
      }
    } else {
      autogenByproducts.push_back(this->Moc.CompilationFileGenex);
    }
  }

  if (this->Uic.Enabled) {
    for (const auto& file : this->Uic.UiHeaders) {
      this->AddGeneratedSource(file.first, this->Uic);
      autogenByproducts.push_back(file.second);
    }
  }

  // Compose target comment
  std::string autogenComment;
  {
    std::string tools;
    if (this->Moc.Enabled) {
      tools += "MOC";
    }
    if (this->Uic.Enabled) {
      if (!tools.empty()) {
        tools += " and ";
      }
      tools += "UIC";
    }
    autogenComment = cmStrCat("Automatic ", tools, " for target ",
                              this->GenTarget->GetName());
  }

  // Compose command lines
  // FIXME: Take advantage of our per-config mocs_compilation_$<CONFIG>.cpp
  // instead of fiddling with the include directories

  bool constexpr stdPipesUTF8 = true;
  cmCustomCommandLines commandLines;
  AddCMakeProcessToCommandLines(this->AutogenTarget.InfoFile, "cmake_autogen",
                                commandLines);

  // Use PRE_BUILD on demand
  bool usePRE_BUILD = false;
  if (this->GlobalGen->GetName().find("Visual Studio") != std::string::npos) {
    // Under VS use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = true;
  }
  // Disable PRE_BUILD in some cases
  if (usePRE_BUILD) {
    // Cannot use PRE_BUILD with file depends
    if (!this->AutogenTarget.DependFiles.empty()) {
      usePRE_BUILD = false;
    }
    // Cannot use PRE_BUILD when a global autogen target is in place
    if (this->AutogenTarget.GlobalTarget) {
      usePRE_BUILD = false;
    }
  }
  // Create the autogen target/command
  if (usePRE_BUILD) {
    // Add additional autogen target dependencies to origin target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      this->GenTarget->Target->AddUtility(depTarget->GetName(), false,
                                          this->Makefile);
    }

    if (!this->Uic.UiFilesNoOptions.empty() ||
        !this->Uic.UiFilesWithOptions.empty()) {
      // Add a generated timestamp file
      ConfigString timestampFile;
      std::string timestampFileGenex;
      ConfigFileNamesAndGenex(timestampFile, timestampFileGenex,
                              cmStrCat(this->Dir.Build, "/autouic"_s),
                              ".stamp"_s);
      this->AddGeneratedSource(timestampFile, this->Uic);

      // Add a step in the pre-build command to touch the timestamp file
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", "touch",
                            timestampFileGenex }));

      // UIC needs to be re-run if any of the known UI files change or the
      // executable itself has been updated
      auto uicDependencies = this->Uic.UiFilesNoOptions;
      for (auto const& uiFile : this->Uic.UiFilesWithOptions) {
        uicDependencies.push_back(uiFile.first);
      }
      AddAutogenExecutableToDependencies(this->Uic, uicDependencies);

      // Add a rule file to cause the target to build if a dependency has
      // changed, which will trigger the pre-build command to run autogen
      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(timestampFileGenex);
      cc->SetDepends(uicDependencies);
      cc->SetComment("");
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
    }

    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    //
    // PRE_BUILD does not support file dependencies!
    cmCustomCommand cc;
    cc.SetByproducts(autogenByproducts);
    cc.SetCommandLines(commandLines);
    cc.SetComment(autogenComment.c_str());
    cc.SetBacktrace(this->Makefile->GetBacktrace());
    cc.SetWorkingDirectory(this->Dir.Work.c_str());
    cc.SetStdPipesUTF8(stdPipesUTF8);
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    this->GenTarget->Target->AddPreBuildCommand(std::move(cc));
  } else {

    // Add link library target dependencies to the autogen target
    // dependencies
    if (this->AutogenTarget.DependOrigin) {
      // add_dependencies/addUtility do not support generator expressions.
      // We depend only on the libraries found in all configs therefore.
      std::map<cmGeneratorTarget const*, std::size_t> commonTargets;
      for (std::string const& config : this->ConfigsList) {
        cmLinkImplementationLibraries const* libs =
          this->GenTarget->GetLinkImplementationLibraries(
            config, cmGeneratorTarget::LinkInterfaceFor::Link);
        if (libs) {
          for (cmLinkItem const& item : libs->Libraries) {
            cmGeneratorTarget const* libTarget = item.Target;
            if (libTarget &&
                !StaticLibraryCycle(this->GenTarget, libTarget, config)) {
              // Increment target config count
              commonTargets[libTarget]++;
            }
          }
        }
      }
      for (auto const& item : commonTargets) {
        if (item.second == this->ConfigsList.size()) {
          this->AutogenTarget.DependTargets.insert(item.first->Target);
        }
      }
    }

    cmTarget* timestampTarget = nullptr;
    std::vector<std::string> dependencies(
      this->AutogenTarget.DependFiles.begin(),
      this->AutogenTarget.DependFiles.end());
    if (useDepfile) {
      // Create a custom command that generates a timestamp file and
      // has a depfile assigned. The depfile is created by JobDepFilesMergeT.
      //
      // Also create an additional '_autogen_timestamp_deps' that the custom
      // command will depend on. It will have no sources or commands to
      // execute, but it will have dependencies that would originally be
      // assigned to the pre-Qt 5.15 'autogen' target. These dependencies will
      // serve as a list of order-only dependencies for the custom command,
      // without forcing the custom command to re-execute.
      //
      // The dependency tree would then look like
      // '_autogen_timestamp_deps (order-only)' <- '/timestamp' file <-
      // '_autogen' target.
      const auto timestampTargetName =
        cmStrCat(this->GenTarget->GetName(), "_autogen_timestamp_deps");

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetDepends(dependencies);
      cc->SetEscapeOldStyle(false);
      timestampTarget = this->LocalGen->AddUtilityCommand(timestampTargetName,
                                                          true, std::move(cc));

      this->LocalGen->AddGeneratorTarget(
        cm::make_unique<cmGeneratorTarget>(timestampTarget, this->LocalGen));

      // Set FOLDER property on the timestamp target, so it appears in the
      // appropriate folder in an IDE or in the file api.
      if (!this->TargetsFolder.empty()) {
        timestampTarget->SetProperty("FOLDER", this->TargetsFolder);
      }

      // Make '/timestamp' file depend on '_autogen_timestamp_deps' and on the
      // moc and uic executables (whichever are enabled).
      dependencies.clear();
      dependencies.push_back(timestampTargetName);

      AddAutogenExecutableToDependencies(this->Moc, dependencies);
      AddAutogenExecutableToDependencies(this->Uic, dependencies);
      std::string outputFile;
      std::string depFile;
      // Create the custom command that outputs the timestamp file.
      if (this->MultiConfig && this->UseBetterGraph) {
        // create timestamp file with $<CONFIG> in the name so that
        // every cmake_autogen target has its own timestamp file
        std::string const configView = "$<CONFIG>";
        std::string const timestampFileWithoutConfig = "timestamp_";
        std::string const depFileWithoutConfig =
          cmStrCat(this->Dir.Build, "/deps_");
        std::string const timestampFileName =
          timestampFileWithoutConfig + configView;
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        auto const depFileWithConfig =
          cmStrCat(depFileWithoutConfig, configView);
        depFile = depFileWithConfig;
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));

        ConfigString outputFileWithConfig;
        for (std::string const& config : this->ConfigsList) {
          auto tempTimestampFileName = timestampFileWithoutConfig + config;
          auto tempDepFile = depFileWithoutConfig + config;
          outputFileWithConfig.Config[config] = tempTimestampFileName;
          this->AutogenTarget.DepFileRuleName.Config[config] =
            cmStrCat(this->Dir.RelativeBuild, "/", tempTimestampFileName);
          this->AutogenTarget.DepFile.Config[config] = tempDepFile;
        }
        this->AddGeneratedSource(outputFileWithConfig, this->Moc);
      } else {
        cm::string_view const timestampFileName = "timestamp";
        outputFile = cmStrCat(this->Dir.Build, "/", timestampFileName);
        this->AutogenTarget.DepFile.Default =
          cmStrCat(this->Dir.Build, "/deps");
        depFile = this->AutogenTarget.DepFile.Default;
        this->AutogenTarget.DepFileRuleName.Default =
          cmStrCat(this->Dir.RelativeBuild, "/", timestampFileName);
        commandLines.push_back(cmMakeCommandLine(
          { cmSystemTools::GetCMakeCommand(), "-E", "touch", outputFile }));
        this->AddGeneratedSource(outputFile, this->Moc);
      }
      cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(outputFile);
      cc->SetByproducts(timestampByproducts);
      cc->SetDepends(dependencies);
      cc->SetCommandLines(commandLines);
      cc->SetComment(autogenComment.c_str());
      cc->SetWorkingDirectory(this->Dir.Work.c_str());
      cc->SetEscapeOldStyle(false);
      cc->SetDepfile(depFile);
      cc->SetStdPipesUTF8(stdPipesUTF8);
      this->LocalGen->AddCustomCommandToOutput(std::move(cc));
      dependencies.clear();
      dependencies.emplace_back(std::move(outputFile));
      commandLines.clear();
      autogenComment.clear();
    }

    // Create autogen target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(this->Dir.Work.c_str());
    cc->SetByproducts(autogenByproducts);
    cc->SetDepends(dependencies);
    cc->SetCommandLines(commandLines);
    cc->SetEscapeOldStyle(false);
    cc->SetComment(autogenComment.c_str());
    cmTarget* autogenTarget = this->LocalGen->AddUtilityCommand(
      this->AutogenTarget.Name, true, std::move(cc));
    // Create autogen generator target
    this->LocalGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(autogenTarget, this->LocalGen));

    // Order the autogen target(s) just before the original target.
    cmTarget* orderTarget = timestampTarget ? timestampTarget : autogenTarget;
    // Forward origin utilities to autogen target
    if (this->AutogenTarget.DependOrigin) {
      for (BT<std::pair<std::string, bool>> const& depName :
           this->GenTarget->GetUtilities()) {
        orderTarget->AddUtility(depName.Value.first, false, this->Makefile);
      }
    }

    // Add additional autogen target dependencies to autogen target
    for (cmTarget const* depTarget : this->AutogenTarget.DependTargets) {
      orderTarget->AddUtility(depTarget->GetName(), false, this->Makefile);
    }

    // Set FOLDER property in autogen target
    if (!this->TargetsFolder.empty()) {
      autogenTarget->SetProperty("FOLDER", this->TargetsFolder);
    }

    // Add autogen target to the origin target dependencies
    this->GenTarget->Target->AddUtility(this->AutogenTarget.Name, false,
                                        this->Makefile);

    // Add autogen target to the global autogen target dependencies
    if (this->AutogenTarget.GlobalTarget) {
      this->GlobalInitializer->AddToGlobalAutoGen(this->LocalGen,
                                                  this->AutogenTarget.Name);
    }
  }

  return true;
}